

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O2

double __thiscall Lesson::score(Lesson *this,double avg_score)

{
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  double dVar8;
  initializer_list<double> __l;
  allocator_type local_79;
  double local_78;
  vector<double,_std::allocator<double>_> a;
  double local_58 [8];
  
  local_58[4] = 0.2;
  local_58[5] = 0.1;
  local_58[2] = 0.3;
  local_58[3] = 0.2;
  local_58[0] = 0.1;
  local_58[1] = 0.4;
  local_58[6] = 0.1;
  __l._M_len = 7;
  __l._M_array = local_58;
  local_78 = avg_score;
  std::vector<double,_std::allocator<double>_>::vector(&a,__l,&local_79);
  pPVar1 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 == pPVar2) {
    dVar8 = local_78 / 5.0 + 0.0;
  }
  else {
    lVar3 = ((long)pPVar2 - (long)pPVar1) / 0xb0;
    pdVar4 = &pPVar1->total;
    dVar8 = 0.0;
    lVar5 = lVar3;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      dVar8 = dVar8 + *pdVar4 / 5.0;
      pdVar4 = pdVar4 + 0x16;
    }
    dVar8 = dVar8 / (double)lVar3;
  }
  fVar7 = roundf((float)((a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[this->lesson_id % 7] + dVar8) * 1000.0));
  local_78 = (double)(fVar7 / 1000.0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&a.super__Vector_base<double,_std::allocator<double>_>);
  return local_78;
}

Assistant:

double Lesson::score(double avg_score)
{
    double professor_score = 0;
    std::vector <double> a = {0.1, 0.4, 0.3, 0.2, 0.2, 0.1, 0.1};
    double location_score = a[lesson_id%7];
    if (!prep_list.empty()) {
        for(int i = 0; i < prep_list.size(); i++){
            professor_score+= double(prep_list[i].total)/5;
        }
        professor_score = professor_score/prep_list.size();
    }
    else {
        professor_score+= double(avg_score)/5;
    }

    return roundf((professor_score + location_score) * 1000 )/ 1000;
}